

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void filemgr_clear_stale_info_tree(filemgr *file)

{
  avl_node *paVar1;
  list_elem *plVar2;
  long in_RDI;
  stale_info_entry *entry;
  stale_info_commit *commit;
  list_elem *e;
  avl_node *a;
  list_elem *local_18;
  avl_node *local_10;
  
  local_10 = avl_first((avl_tree *)(in_RDI + 0x288));
  while (local_10 != (avl_node *)0x0) {
    paVar1 = avl_next(local_10);
    avl_remove((avl_tree *)e,&commit->avl);
    local_18 = list_begin((list *)&local_10[1].left);
    while (local_18 != (list_elem *)0x0) {
      plVar2 = list_next(local_18);
      list_remove((list *)&local_10[1].left,local_18);
      free(local_18[1].prev);
      free(local_18);
      local_18 = plVar2;
    }
    free(local_10);
    local_10 = paVar1;
  }
  return;
}

Assistant:

void filemgr_clear_stale_info_tree(struct filemgr *file)
{
    struct avl_node *a;
    struct list_elem *e;
    struct stale_info_commit *commit;
    struct stale_info_entry *entry;

    a = avl_first(&file->stale_info_tree);
    while (a) {
        commit = _get_entry(a, struct stale_info_commit, avl);
        a = avl_next(&commit->avl);
        avl_remove(&file->stale_info_tree, &commit->avl);

        e = list_begin(&commit->doc_list);
        while (e) {
            entry = _get_entry(e, struct stale_info_entry, le);
            e = list_next(&entry->le);
            list_remove(&commit->doc_list, &entry->le);
            free(entry->ctx);
            free(entry);
        }
        free(commit);
    }
}